

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

void __thiscall
flow::lang::ASTPrinter::print
          (ASTPrinter *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
          *node,size_t pos)

{
  ulong uVar1;
  undefined8 uVar2;
  char local_428 [8];
  char buf [1024];
  size_t pos_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
  *node_local;
  ASTPrinter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    snprintf(local_428,0x400,"%s:",uVar2);
  }
  else {
    snprintf(local_428,0x400,"param #%zu:",pos);
  }
  print(this,local_428,&node->second->super_ASTNode);
  return;
}

Assistant:

void ASTPrinter::print(const std::pair<std::string, Expr*>& node, size_t pos) {
  char buf[1024];
  if (!node.first.empty()) {
    snprintf(buf, sizeof(buf), "%s:", node.first.c_str());
  } else {
    snprintf(buf, sizeof(buf), "param #%zu:", pos);
  }
  print(buf, node.second);
}